

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_lookup.cpp
# Opt level: O3

SN_ELEMENT * __thiscall ON_SerialNumberMap::FirstElement(ON_SerialNumberMap *this)

{
  uint uVar1;
  ulong uVar2;
  SN_ELEMENT *pSVar3;
  ON__UINT64 OVar4;
  ON_SN_BLOCK *pOVar5;
  
  if (this->m_snblk_list_count != 0) {
    pSVar3 = (SN_ELEMENT *)0x0;
    OVar4 = 0;
    do {
      pOVar5 = this->m_snblk_list[OVar4];
      uVar2 = (ulong)pOVar5->m_count;
      if (pOVar5->m_purged < pOVar5->m_count) {
        pSVar3 = pOVar5->m_sn;
        goto LAB_004cf70a;
      }
      OVar4 = OVar4 + 1;
    } while (this->m_snblk_list_count != OVar4);
    goto LAB_004cf71b;
  }
  goto LAB_004cf719;
  while( true ) {
    pSVar3 = pSVar3 + 1;
    uVar2 = uVar2 - 1;
    if (uVar2 == 0) break;
LAB_004cf70a:
    if (pSVar3->m_sn_active != '\0') goto LAB_004cf71b;
  }
LAB_004cf719:
  pSVar3 = (SN_ELEMENT *)0x0;
LAB_004cf71b:
  pOVar5 = this->m_sn_block0;
  uVar1 = pOVar5->m_purged;
  if ((uVar1 < pOVar5->m_count) && ((pSVar3 == (SN_ELEMENT *)0x0 || (pOVar5->m_sn0 < pSVar3->m_sn)))
     ) {
    if (uVar1 != 0) {
      if (this->m_bHashTableIsValid != '\0') {
        this->m_bHashTableIsValid = '\0';
      }
      this->m_sn_count = this->m_sn_count - (ulong)uVar1;
      this->m_sn_purged = this->m_sn_purged - (ulong)uVar1;
      ON_SN_BLOCK::CullBlockHelper(pOVar5);
      pOVar5 = this->m_sn_block0;
    }
    if (pOVar5->m_sorted == 0) {
      if (this->m_bHashTableIsValid != '\0') {
        this->m_bHashTableIsValid = '\0';
      }
      ON_SN_BLOCK::SortBlockHelper(pOVar5);
      pOVar5 = this->m_sn_block0;
    }
    if ((pSVar3 == (SN_ELEMENT *)0x0) || (pOVar5->m_sn0 < pSVar3->m_sn)) {
      pSVar3 = pOVar5->m_sn;
    }
  }
  return pSVar3;
}

Assistant:

ON_SerialNumberMap::SN_ELEMENT* ON_SerialNumberMap::FirstElement() const
{
  SN_ELEMENT* e=nullptr;

  // The first element is likely to be m_snblk_list[0]->m_sn[0]
  // so start looking there.
  // The nullptr==e test isn't necessary. It is there to keep
  // the VisualC++ 2022 compiler from crashing.
  for(size_t i = 0; i < m_snblk_list_count && nullptr==e; i++)
  {
    if ( m_snblk_list[i]->m_count > m_snblk_list[i]->m_purged )
    {
      for (size_t j = 0; j < m_snblk_list[i]->m_count; j++ )
      {
        if ( m_snblk_list[i]->m_sn[j].m_sn_active )
        {
          e = &m_snblk_list[i]->m_sn[j];
          break;
        }
      }
      break;
    }
  }

  if ( m_sn_block0.m_count > m_sn_block0.m_purged 
       && (!e || m_sn_block0.m_sn0 < e->m_sn) 
     )
  {
    // It's possible the element is in m_sn_block0.
    if ( m_sn_block0.m_purged > 0 )
    {
      // remove purged elements from m_sn_block0.

      // memory location for specific elements will be changed.
      // This will make the hash table invalid.
      const_cast<ON_SerialNumberMap*>(this)->Internal_HashTableInvalidate();

      const_cast<ON_SerialNumberMap*>(this)->m_sn_count -= m_sn_block0.m_purged;
      const_cast<ON_SerialNumberMap*>(this)->m_sn_purged -= m_sn_block0.m_purged;
      const_cast<ON_SerialNumberMap*>(this)->m_sn_block0.CullBlockHelper();
    }
    if ( !m_sn_block0.m_sorted )
    {
      // sort elements in m_sn_block0.

      // memory location for specific elements will be changed.
      // This will make the hash table invalid.
      const_cast<ON_SerialNumberMap*>(this)->Internal_HashTableInvalidate();

      const_cast<ON_SerialNumberMap*>(this)->m_sn_block0.SortBlockHelper();      
    }
    if ( !e || m_sn_block0.m_sn0 <  e->m_sn )
    {
      // first element in m_sn_block0 is the
      // one with the smallest serial number.
      e = const_cast<struct SN_ELEMENT*>(&m_sn_block0.m_sn[0]);
    }
  }
  return e;
}